

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O0

void * crazyOpen(char *URI)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  char *URI_local;
  
  if ((URI != (char *)0x0) && (iVar1 = strncmp(URI,"crazy:",6), iVar1 == 0)) {
    uVar2 = (ulong)crazy_indx;
    sVar3 = strlen(crazy);
    if (sVar3 < uVar2) {
      return (void *)0x0;
    }
    reset_timout();
    rlen = crazy_indx;
    current = crazy;
    instate = 0;
    return crazy;
  }
  return (void *)0x0;
}

Assistant:

static void *
crazyOpen(const char * URI) {
    if ((URI == NULL) || (strncmp(URI, "crazy:", 6)))
        return(NULL);

    if (crazy_indx > strlen(crazy))
        return(NULL);
    reset_timout();
    rlen = crazy_indx;
    current = &crazy[0];
    instate = 0;
    return((void *) current);
}